

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

ConfusableMatcher * LidlNormalizerCMSetup(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  ulong uVar1;
  size_type sVar2;
  reference __x;
  reference __y;
  ConfusableMatcher *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4590;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3828;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_37f0;
  ConfusableMatcher *local_37d8;
  ConfusableMatcher *matcher;
  int local_378c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3787;
  undefined1 local_3786;
  allocator<char> local_3785;
  int x;
  allocator<char> local_3780;
  allocator<char> local_377f;
  allocator<char> local_377e;
  allocator<char> local_377d;
  allocator<char> local_377c;
  allocator<char> local_377b;
  allocator<char> local_377a;
  allocator<char> local_3779;
  allocator<char> local_3778;
  allocator<char> local_3777;
  allocator<char> local_3776;
  allocator<char> local_3775;
  allocator<char> local_3774;
  allocator<char> local_3773;
  allocator<char> local_3772;
  allocator<char> local_3771;
  allocator<char> local_3770;
  allocator<char> local_376f;
  allocator<char> local_376e;
  allocator<char> local_376d;
  allocator<char> local_376c;
  allocator<char> local_376b;
  allocator<char> local_376a;
  allocator<char> local_3769;
  allocator<char> local_3768;
  allocator<char> local_3767;
  allocator<char> local_3766;
  allocator<char> local_3765;
  allocator<char> local_3764;
  allocator<char> local_3763;
  allocator<char> local_3762;
  allocator<char> local_3761;
  allocator<char> local_3760;
  allocator<char> local_375f;
  allocator<char> local_375e;
  allocator<char> local_375d;
  allocator<char> local_375c;
  allocator<char> local_375b;
  allocator<char> local_375a;
  allocator<char> local_3759;
  allocator<char> local_3758;
  allocator<char> local_3757;
  allocator<char> local_3756;
  allocator<char> local_3755;
  allocator<char> local_3754;
  allocator<char> local_3753;
  allocator<char> local_3752;
  allocator<char> local_3751;
  allocator<char> local_3750;
  allocator<char> local_374f;
  allocator<char> local_374e;
  allocator<char> local_374d;
  allocator<char> local_374c;
  allocator<char> local_374b;
  allocator<char> local_374a;
  allocator<char> local_3749;
  allocator<char> local_3748;
  allocator<char> local_3747;
  allocator<char> local_3746;
  allocator<char> local_3745;
  allocator<char> local_3744;
  allocator<char> local_3743;
  allocator<char> local_3742;
  allocator<char> local_3741;
  allocator<char> local_3740;
  allocator<char> local_373f;
  allocator<char> local_373e;
  allocator<char> local_373d;
  allocator<char> local_373c;
  allocator<char> local_373b;
  allocator<char> local_373a;
  allocator<char> local_3739;
  allocator<char> local_3738;
  allocator<char> local_3737;
  allocator<char> local_3736;
  allocator<char> local_3735;
  allocator<char> local_3734;
  allocator<char> local_3733;
  allocator<char> local_3732;
  allocator<char> local_3731;
  allocator<char> local_3730;
  allocator<char> local_372f;
  allocator<char> local_372e;
  allocator<char> local_372d;
  allocator<char> local_372c;
  allocator<char> local_372b;
  allocator<char> local_372a;
  allocator<char> local_3729;
  allocator<char> local_3728;
  allocator<char> local_3727;
  allocator<char> local_3726;
  allocator<char> local_3725;
  allocator<char> local_3724;
  allocator<char> local_3723;
  allocator<char> local_3722;
  allocator<char> local_3721;
  allocator<char> local_3720;
  allocator<char> local_371f;
  allocator<char> local_371e;
  allocator<char> local_371d;
  allocator<char> local_371c;
  allocator<char> local_371b;
  allocator<char> local_371a;
  allocator<char> local_3719;
  allocator<char> local_3718;
  allocator<char> local_3717;
  allocator<char> local_3716;
  allocator<char> local_3715;
  allocator<char> local_3714;
  allocator<char> local_3713;
  allocator<char> local_3712;
  allocator<char> local_3711;
  allocator<char> local_3710;
  allocator<char> local_370f;
  allocator<char> local_370e;
  allocator<char> local_370d;
  allocator<char> local_370c;
  allocator<char> local_370b;
  allocator<char> local_370a;
  allocator<char> local_3709;
  allocator<char> local_3708;
  allocator<char> local_3707;
  allocator<char> local_3706;
  allocator<char> local_3705;
  allocator<char> local_3704;
  allocator<char> local_3703;
  allocator<char> local_3702;
  allocator<char> local_3701;
  allocator<char> local_3700;
  allocator<char> local_36ff;
  allocator<char> local_36fe;
  allocator<char> local_36fd;
  allocator<char> local_36fc;
  allocator<char> local_36fb;
  allocator<char> local_36fa;
  allocator<char> local_36f9;
  allocator<char> local_36f8;
  allocator<char> local_36f7;
  allocator<char> local_36f6;
  allocator<char> local_36f5;
  allocator<char> local_36f4;
  allocator<char> local_36f3;
  allocator<char> local_36f2;
  allocator<char> local_36f1;
  allocator<char> local_36f0;
  allocator<char> local_36ef;
  allocator<char> local_36ee;
  allocator<char> local_36ed;
  allocator<char> local_36ec;
  allocator<char> local_36eb;
  allocator<char> local_36ea;
  allocator<char> local_36e9;
  allocator<char> local_36e8;
  allocator<char> local_36e7;
  allocator<char> local_36e6;
  allocator<char> local_36e5;
  allocator<char> local_36e4;
  allocator<char> local_36e3;
  allocator<char> local_36e2;
  allocator<char> local_36e1;
  allocator<char> local_36e0;
  allocator<char> local_36df;
  allocator<char> local_36de;
  allocator<char> local_36dd;
  allocator<char> local_36dc;
  allocator<char> local_36db;
  allocator<char> local_36da;
  allocator<char> local_36d9;
  allocator<char> local_36d8;
  allocator<char> local_36d7;
  allocator<char> local_36d6;
  allocator<char> local_36d5;
  allocator<char> local_36d4;
  allocator<char> local_36d3;
  allocator<char> local_36d2;
  allocator<char> local_36d1;
  allocator<char> local_36d0;
  allocator<char> local_36cf;
  allocator<char> local_36ce;
  allocator<char> local_36cd;
  allocator<char> local_36cc;
  allocator<char> local_36cb;
  allocator<char> local_36ca;
  allocator<char> local_36c9;
  allocator<char> local_36c8;
  allocator<char> local_36c7;
  allocator<char> local_36c6;
  allocator<char> local_36c5;
  allocator<char> local_36c4;
  allocator<char> local_36c3;
  allocator<char> local_36c2;
  allocator<char> local_36c1;
  allocator<char> local_36c0;
  allocator<char> local_36bf;
  allocator<char> local_36be;
  allocator<char> local_36bd;
  allocator<char> local_36bc;
  allocator<char> local_36bb;
  allocator<char> local_36ba;
  allocator<char> local_36b9;
  allocator<char> local_36b8;
  allocator<char> local_36b7;
  allocator<char> local_36b6;
  allocator<char> local_36b5;
  allocator<char> local_36b4;
  allocator<char> local_36b3;
  allocator<char> local_36b2;
  allocator<char> local_36b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_36b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_36a8;
  string local_3688 [32];
  string local_3668 [32];
  string local_3648 [32];
  string local_3628 [32];
  string local_3608 [32];
  string local_35e8 [32];
  string local_35c8 [32];
  string local_35a8 [32];
  string local_3588 [32];
  string local_3568 [32];
  string local_3548 [32];
  string local_3528 [32];
  string local_3508 [32];
  string local_34e8 [32];
  string local_34c8 [32];
  string local_34a8 [32];
  string local_3488 [32];
  string local_3468 [32];
  string local_3448 [32];
  string local_3428 [32];
  string local_3408 [32];
  string local_33e8 [32];
  string local_33c8 [32];
  string local_33a8 [32];
  string local_3388 [32];
  string local_3368 [32];
  string local_3348 [32];
  string local_3328 [32];
  string local_3308 [32];
  string local_32e8 [32];
  string local_32c8 [32];
  string local_32a8 [32];
  string local_3288 [32];
  string local_3268 [32];
  string local_3248 [32];
  string local_3228 [32];
  string local_3208 [32];
  string local_31e8 [32];
  string local_31c8 [32];
  string local_31a8 [32];
  string local_3188 [32];
  string local_3168 [32];
  string local_3148 [32];
  string local_3128 [32];
  string local_3108 [32];
  string local_30e8 [32];
  string local_30c8 [32];
  string local_30a8 [32];
  string local_3088 [32];
  string local_3068 [32];
  string local_3048 [32];
  string local_3028 [32];
  string local_3008 [32];
  string local_2fe8 [32];
  string local_2fc8 [32];
  string local_2fa8 [32];
  string local_2f88 [32];
  string local_2f68 [32];
  string local_2f48 [32];
  string local_2f28 [32];
  string local_2f08 [32];
  string local_2ee8 [32];
  string local_2ec8 [32];
  string local_2ea8 [32];
  string local_2e88 [32];
  string local_2e68 [32];
  string local_2e48 [32];
  string local_2e28 [32];
  string local_2e08 [32];
  string local_2de8 [32];
  string local_2dc8 [32];
  string local_2da8 [32];
  string local_2d88 [32];
  string local_2d68 [32];
  string local_2d48 [32];
  string local_2d28 [32];
  string local_2d08 [32];
  string local_2ce8 [32];
  string local_2cc8 [32];
  string local_2ca8 [32];
  string local_2c88 [32];
  string local_2c68 [32];
  string local_2c48 [32];
  string local_2c28 [32];
  string local_2c08 [32];
  string local_2be8 [32];
  string local_2bc8 [32];
  string local_2ba8 [32];
  string local_2b88 [32];
  string local_2b68 [32];
  string local_2b48 [32];
  string local_2b28 [32];
  string local_2b08 [32];
  string local_2ae8 [32];
  string local_2ac8 [32];
  string local_2aa8 [32];
  string local_2a88 [32];
  string local_2a68 [32];
  string local_2a48 [32];
  string local_2a28 [32];
  string local_2a08 [32];
  string local_29e8 [32];
  string local_29c8 [32];
  string local_29a8 [32];
  string local_2988 [32];
  string local_2968 [32];
  string local_2948 [32];
  string local_2928 [32];
  string local_2908 [32];
  string local_28e8 [32];
  string local_28c8 [32];
  string local_28a8 [32];
  string local_2888 [32];
  string local_2868 [32];
  string local_2848 [32];
  string local_2828 [32];
  string local_2808 [32];
  string local_27e8 [32];
  string local_27c8 [32];
  string local_27a8 [32];
  string local_2788 [32];
  string local_2768 [32];
  string local_2748 [32];
  string local_2728 [32];
  string local_2708 [32];
  string local_26e8 [32];
  string local_26c8 [32];
  string local_26a8 [32];
  string local_2688 [32];
  string local_2668 [32];
  string local_2648 [32];
  string local_2628 [32];
  string local_2608 [32];
  string local_25e8 [32];
  string local_25c8 [32];
  string local_25a8 [32];
  string local_2588 [32];
  string local_2568 [32];
  string local_2548 [32];
  string local_2528 [32];
  string local_2508 [32];
  string local_24e8 [32];
  string local_24c8 [32];
  string local_24a8 [32];
  string local_2488 [32];
  string local_2468 [32];
  string local_2448 [32];
  string local_2428 [32];
  string local_2408 [32];
  string local_23e8 [32];
  string local_23c8 [32];
  string local_23a8 [32];
  string local_2388 [32];
  string local_2368 [32];
  string local_2348 [32];
  string local_2328 [32];
  string local_2308 [32];
  string local_22e8 [32];
  string local_22c8 [32];
  string local_22a8 [32];
  string local_2288 [32];
  string local_2268 [32];
  string local_2248 [32];
  string local_2228 [32];
  string local_2208 [32];
  string local_21e8 [32];
  string local_21c8 [32];
  string local_21a8 [32];
  string local_2188 [32];
  string local_2168 [32];
  string local_2148 [32];
  string local_2128 [32];
  string local_2108 [32];
  string local_20e8 [32];
  string local_20c8 [32];
  string local_20a8 [32];
  string local_2088 [32];
  string local_2068 [32];
  string local_2048 [32];
  string local_2028 [32];
  string local_2008 [32];
  string local_1fe8 [32];
  string local_1fc8 [32];
  string local_1fa8 [32];
  string local_1f88 [32];
  string local_1f68 [32];
  string local_1f48 [32];
  string local_1f28 [32];
  string local_1f08 [32];
  string local_1ee8 [32];
  string local_1ec8 [32];
  string local_1ea8 [32];
  string local_1e88 [32];
  string local_1e68 [32];
  string local_1e48 [32];
  string local_1e28 [32];
  string local_1e08 [32];
  string local_1de8 [32];
  string local_1dc8 [32];
  string local_1da8 [32];
  string local_1d88 [32];
  string local_1d68 [32];
  string local_1d48 [32];
  string local_1d28 [32];
  string local_1d08 [32];
  string local_1ce8 [32];
  string local_1cc8 [32];
  string local_1ca8 [32];
  string local_1c88 [32];
  string local_1c68 [32];
  string local_1c48 [32];
  string local_1c28 [32];
  iterator local_1c08;
  size_type local_1c00;
  undefined1 local_1bf8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vals;
  allocator<char> local_1bd8;
  allocator<char> local_1bd7;
  allocator<char> local_1bd6;
  allocator<char> local_1bd5;
  allocator<char> local_1bd4;
  allocator<char> local_1bd3;
  allocator<char> local_1bd2;
  allocator<char> local_1bd1;
  allocator<char> local_1bd0;
  allocator<char> local_1bcf;
  allocator<char> local_1bce;
  allocator<char> local_1bcd;
  allocator<char> local_1bcc;
  allocator<char> local_1bcb;
  allocator<char> local_1bca;
  allocator<char> local_1bc9;
  allocator<char> local_1bc8;
  allocator<char> local_1bc7;
  allocator<char> local_1bc6;
  allocator<char> local_1bc5;
  allocator<char> local_1bc4;
  allocator<char> local_1bc3;
  allocator<char> local_1bc2;
  allocator<char> local_1bc1;
  allocator<char> local_1bc0;
  allocator<char> local_1bbf;
  allocator<char> local_1bbe;
  allocator<char> local_1bbd;
  allocator<char> local_1bbc;
  allocator<char> local_1bbb;
  allocator<char> local_1bba;
  allocator<char> local_1bb9;
  allocator<char> local_1bb8;
  allocator<char> local_1bb7;
  allocator<char> local_1bb6;
  allocator<char> local_1bb5;
  allocator<char> local_1bb4;
  allocator<char> local_1bb3;
  allocator<char> local_1bb2;
  allocator<char> local_1bb1;
  allocator<char> local_1bb0;
  allocator<char> local_1baf;
  allocator<char> local_1bae;
  allocator<char> local_1bad;
  allocator<char> local_1bac;
  allocator<char> local_1bab;
  allocator<char> local_1baa;
  allocator<char> local_1ba9;
  allocator<char> local_1ba8;
  allocator<char> local_1ba7;
  allocator<char> local_1ba6;
  allocator<char> local_1ba5;
  allocator<char> local_1ba4;
  allocator<char> local_1ba3;
  allocator<char> local_1ba2;
  allocator<char> local_1ba1;
  allocator<char> local_1ba0;
  allocator<char> local_1b9f;
  allocator<char> local_1b9e;
  allocator<char> local_1b9d;
  allocator<char> local_1b9c;
  allocator<char> local_1b9b;
  allocator<char> local_1b9a;
  allocator<char> local_1b99;
  allocator<char> local_1b98;
  allocator<char> local_1b97;
  allocator<char> local_1b96;
  allocator<char> local_1b95;
  allocator<char> local_1b94;
  allocator<char> local_1b93;
  allocator<char> local_1b92;
  allocator<char> local_1b91;
  allocator<char> local_1b90;
  allocator<char> local_1b8f;
  allocator<char> local_1b8e;
  allocator<char> local_1b8d;
  allocator<char> local_1b8c;
  allocator<char> local_1b8b;
  allocator<char> local_1b8a;
  allocator<char> local_1b89;
  allocator<char> local_1b88;
  allocator<char> local_1b87;
  allocator<char> local_1b86;
  allocator<char> local_1b85;
  allocator<char> local_1b84;
  allocator<char> local_1b83;
  allocator<char> local_1b82;
  allocator<char> local_1b81;
  allocator<char> local_1b80;
  allocator<char> local_1b7f;
  allocator<char> local_1b7e;
  allocator<char> local_1b7d;
  allocator<char> local_1b7c;
  allocator<char> local_1b7b;
  allocator<char> local_1b7a;
  allocator<char> local_1b79;
  allocator<char> local_1b78;
  allocator<char> local_1b77;
  allocator<char> local_1b76;
  allocator<char> local_1b75;
  allocator<char> local_1b74;
  allocator<char> local_1b73;
  allocator<char> local_1b72;
  allocator<char> local_1b71;
  allocator<char> local_1b70;
  allocator<char> local_1b6f;
  allocator<char> local_1b6e;
  allocator<char> local_1b6d;
  allocator<char> local_1b6c;
  allocator<char> local_1b6b;
  allocator<char> local_1b6a;
  allocator<char> local_1b69;
  allocator<char> local_1b68;
  allocator<char> local_1b67;
  allocator<char> local_1b66;
  allocator<char> local_1b65;
  allocator<char> local_1b64;
  allocator<char> local_1b63;
  allocator<char> local_1b62;
  allocator<char> local_1b61;
  allocator<char> local_1b60;
  allocator<char> local_1b5f;
  allocator<char> local_1b5e;
  allocator<char> local_1b5d;
  allocator<char> local_1b5c;
  allocator<char> local_1b5b;
  allocator<char> local_1b5a;
  allocator<char> local_1b59;
  allocator<char> local_1b58;
  allocator<char> local_1b57;
  allocator<char> local_1b56;
  allocator<char> local_1b55;
  allocator<char> local_1b54;
  allocator<char> local_1b53;
  allocator<char> local_1b52;
  allocator<char> local_1b51;
  allocator<char> local_1b50;
  allocator<char> local_1b4f;
  allocator<char> local_1b4e;
  allocator<char> local_1b4d;
  allocator<char> local_1b4c;
  allocator<char> local_1b4b;
  allocator<char> local_1b4a;
  allocator<char> local_1b49;
  allocator<char> local_1b48;
  allocator<char> local_1b47;
  allocator<char> local_1b46;
  allocator<char> local_1b45;
  allocator<char> local_1b44;
  allocator<char> local_1b43;
  allocator<char> local_1b42;
  allocator<char> local_1b41;
  allocator<char> local_1b40;
  allocator<char> local_1b3f;
  allocator<char> local_1b3e;
  allocator<char> local_1b3d;
  allocator<char> local_1b3c;
  allocator<char> local_1b3b;
  allocator<char> local_1b3a;
  allocator<char> local_1b39;
  allocator<char> local_1b38;
  allocator<char> local_1b37;
  allocator<char> local_1b36;
  allocator<char> local_1b35;
  allocator<char> local_1b34;
  allocator<char> local_1b33;
  allocator<char> local_1b32;
  allocator<char> local_1b31;
  allocator<char> local_1b30;
  allocator<char> local_1b2f;
  allocator<char> local_1b2e;
  allocator<char> local_1b2d;
  allocator<char> local_1b2c;
  allocator<char> local_1b2b;
  allocator<char> local_1b2a;
  allocator<char> local_1b29;
  allocator<char> local_1b28;
  allocator<char> local_1b27;
  allocator<char> local_1b26;
  allocator<char> local_1b25;
  allocator<char> local_1b24;
  allocator<char> local_1b23;
  allocator<char> local_1b22;
  allocator<char> local_1b21;
  allocator<char> local_1b20;
  allocator<char> local_1b1f;
  allocator<char> local_1b1e;
  allocator<char> local_1b1d;
  allocator<char> local_1b1c;
  allocator<char> local_1b1b;
  allocator<char> local_1b1a;
  allocator<char> local_1b19;
  allocator<char> local_1b18;
  allocator<char> local_1b17;
  allocator<char> local_1b16;
  allocator<char> local_1b15;
  allocator<char> local_1b14;
  allocator<char> local_1b13;
  allocator<char> local_1b12;
  allocator<char> local_1b11;
  allocator<char> local_1b10;
  allocator<char> local_1b0f;
  allocator<char> local_1b0e;
  allocator<char> local_1b0d;
  allocator<char> local_1b0c;
  allocator<char> local_1b0b;
  allocator<char> local_1b0a;
  allocator<char> local_1b09;
  allocator<char> local_1b08;
  allocator<char> local_1b07;
  allocator<char> local_1b06;
  allocator<char> local_1b05 [20];
  allocator<char> local_1af1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ae8;
  string local_1ac8 [32];
  string local_1aa8 [32];
  string local_1a88 [32];
  string local_1a68 [32];
  string local_1a48 [32];
  string local_1a28 [32];
  string local_1a08 [32];
  string local_19e8 [32];
  string local_19c8 [32];
  string local_19a8 [32];
  string local_1988 [32];
  string local_1968 [32];
  string local_1948 [32];
  string local_1928 [32];
  string local_1908 [32];
  string local_18e8 [32];
  string local_18c8 [32];
  string local_18a8 [32];
  string local_1888 [32];
  string local_1868 [32];
  string local_1848 [32];
  string local_1828 [32];
  string local_1808 [32];
  string local_17e8 [32];
  string local_17c8 [32];
  string local_17a8 [32];
  string local_1788 [32];
  string local_1768 [32];
  string local_1748 [32];
  string local_1728 [32];
  string local_1708 [32];
  string local_16e8 [32];
  string local_16c8 [32];
  string local_16a8 [32];
  string local_1688 [32];
  string local_1668 [32];
  string local_1648 [32];
  string local_1628 [32];
  string local_1608 [32];
  string local_15e8 [32];
  string local_15c8 [32];
  string local_15a8 [32];
  string local_1588 [32];
  string local_1568 [32];
  string local_1548 [32];
  string local_1528 [32];
  string local_1508 [32];
  string local_14e8 [32];
  string local_14c8 [32];
  string local_14a8 [32];
  string local_1488 [32];
  string local_1468 [32];
  string local_1448 [32];
  string local_1428 [32];
  string local_1408 [32];
  string local_13e8 [32];
  string local_13c8 [32];
  string local_13a8 [32];
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  string local_1308 [32];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  string local_1228 [32];
  string local_1208 [32];
  string local_11e8 [32];
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  string local_1108 [32];
  string local_10e8 [32];
  string local_10c8 [32];
  string local_10a8 [32];
  string local_1088 [32];
  string local_1068 [32];
  string local_1048 [32];
  string local_1028 [32];
  string local_1008 [32];
  string local_fe8 [32];
  string local_fc8 [32];
  string local_fa8 [32];
  string local_f88 [32];
  string local_f68 [32];
  string local_f48 [32];
  string local_f28 [32];
  string local_f08 [32];
  string local_ee8 [32];
  string local_ec8 [32];
  string local_ea8 [32];
  string local_e88 [32];
  string local_e68 [32];
  string local_e48 [32];
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8 [32];
  string local_da8 [32];
  string local_d88 [32];
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  string local_d08 [32];
  string local_ce8 [32];
  string local_cc8 [32];
  string local_ca8 [32];
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [32];
  string local_c28 [32];
  string local_c08 [32];
  string local_be8 [32];
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string local_908 [32];
  string local_8e8 [32];
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  GetDefaultMap_abi_cxx11_();
  vals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  local_1af0 = &local_1ae8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ae8,"A",&local_1af1);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ac8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1ac8,"A",local_1b05);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1aa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1aa8,"A",&local_1b06);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a88,"A",&local_1b07);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a68,"B",&local_1b08);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a48,"U",&local_1b09);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a28,"U",&local_1b0a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a08,"O",&local_1b0b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_19e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_19e8,"O",&local_1b0c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_19c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_19c8,"A",&local_1b0d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_19a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_19a8,"A",&local_1b0e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1988;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1988,"A",&local_1b0f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1968;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1968,"C",&local_1b10);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1948;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1948,"D",&local_1b11);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1928;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1928,"E",&local_1b12);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1908;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1908,"F",&local_1b13);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_18e8,"G",&local_1b14);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_18c8,"H",&local_1b15);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_18a8,"I",&local_1b16);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1888;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1888,"J",&local_1b17);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1868,"K",&local_1b18);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1848;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1848,"L",&local_1b19);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1828;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1828,"M",&local_1b1a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1808,"N",&local_1b1b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_17e8,"O",&local_1b1c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_17c8,"P",&local_1b1d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_17a8,"Q",&local_1b1e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1788;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1788,"R",&local_1b1f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1768;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1768,"S",&local_1b20);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1748;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1748,"T",&local_1b21);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1728;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1728,"U",&local_1b22);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1708;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1708,"V",&local_1b23);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_16e8,"W",&local_1b24);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_16c8,"X",&local_1b25);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_16a8,"Y",&local_1b26);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1688;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1688,"Z",&local_1b27);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1668;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1668,"A",&local_1b28);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1648;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1648,"B",&local_1b29);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1628;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1628,"C",&local_1b2a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1608;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1608,"D",&local_1b2b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_15e8,"E",&local_1b2c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_15c8,"F",&local_1b2d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_15a8,"G",&local_1b2e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1588,"H",&local_1b2f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1568;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1568,"I",&local_1b30);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1548,"J",&local_1b31);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1528,"K",&local_1b32);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1508;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1508,"L",&local_1b33);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_14e8,"M",&local_1b34);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_14c8,"N",&local_1b35);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_14a8,"O",&local_1b36);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1488,"P",&local_1b37);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1468,"Q",&local_1b38);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1448,"R",&local_1b39);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1428,"S",&local_1b3a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1408,"T",&local_1b3b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_13e8,"U",&local_1b3c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_13c8,"V",&local_1b3d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_13a8,"W",&local_1b3e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1388,"X",&local_1b3f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1368,"Y",&local_1b40);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1348,"Z",&local_1b41);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1328,"0",&local_1b42);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1308,"A",&local_1b43);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_12e8,"B",&local_1b44);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_12c8,"C",&local_1b45);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_12a8,"D",&local_1b46);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1288,"E",&local_1b47);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1268,"F",&local_1b48);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1248,"G",&local_1b49);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1228,"H",&local_1b4a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1208,"I",&local_1b4b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11e8,"J",&local_1b4c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11c8,"K",&local_1b4d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11a8,"L",&local_1b4e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1188,"M",&local_1b4f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1168,"N",&local_1b50);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1148,"O",&local_1b51);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1128,"P",&local_1b52);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1108,"Q",&local_1b53);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_10e8,"R",&local_1b54);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_10c8,"S",&local_1b55);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_10a8,"T",&local_1b56);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1088;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1088,"U",&local_1b57);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1068;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1068,"V",&local_1b58);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1048;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1048,"W",&local_1b59);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1028;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1028,"X",&local_1b5a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1008;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1008,"Y",&local_1b5b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fe8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fe8,"Z",&local_1b5c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fc8,"A",&local_1b5d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fa8,"B",&local_1b5e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f88,"C",&local_1b5f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f68,"D",&local_1b60);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f48,"E",&local_1b61);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f28,"F",&local_1b62);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f08,"G",&local_1b63);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ee8,"H",&local_1b64);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ec8,"I",&local_1b65);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ea8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ea8,"J",&local_1b66);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e88,"K",&local_1b67);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e68,"L",&local_1b68);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e48,"M",&local_1b69);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e28,"N",&local_1b6a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e08,"O",&local_1b6b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_de8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_de8,"P",&local_1b6c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_dc8,"Q",&local_1b6d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_da8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_da8,"R",&local_1b6e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d88,"S",&local_1b6f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d68,"T",&local_1b70);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d48,"U",&local_1b71);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d28,"V",&local_1b72);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d08,"W",&local_1b73);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ce8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ce8,"X",&local_1b74);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_cc8,"Y",&local_1b75);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ca8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ca8,"Z",&local_1b76);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"A",&local_1b77);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c68,"B",&local_1b78);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c48,"C",&local_1b79);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c28,"D",&local_1b7a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c08,"E",&local_1b7b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_be8,"F",&local_1b7c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bc8,"G",&local_1b7d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ba8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ba8,"H",&local_1b7e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b88,"I",&local_1b7f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b68,"J",&local_1b80);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b48,"K",&local_1b81);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b28,"L",&local_1b82);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b08,"M",&local_1b83);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ae8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ae8,"N",&local_1b84);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ac8,"O",&local_1b85);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_aa8,"P",&local_1b86);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a88,"Q",&local_1b87);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a68,"R",&local_1b88);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a48,"S",&local_1b89);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a28,"T",&local_1b8a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a08,"U",&local_1b8b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9e8,"V",&local_1b8c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9c8,"W",&local_1b8d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9a8,"X",&local_1b8e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_988;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_988,"Y",&local_1b8f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_968,"Z",&local_1b90);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_948;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_948,"A",&local_1b91);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_928,"B",&local_1b92);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_908,"C",&local_1b93);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8e8,"D",&local_1b94);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8c8,"E",&local_1b95);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8a8,"F",&local_1b96);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_888,"G",&local_1b97);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_868,"H",&local_1b98);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_848;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_848,"I",&local_1b99);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_828;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_828,"J",&local_1b9a);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_808;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_808,"K",&local_1b9b);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7e8,"L",&local_1b9c);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"M",&local_1b9d);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7a8,"N",&local_1b9e);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_788;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_788,"O",&local_1b9f);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_768,"P",&local_1ba0);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_748,"Q",&local_1ba1);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_728,"R",&local_1ba2);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_708,"S",&local_1ba3);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6e8,"T",&local_1ba4);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6c8,"U",&local_1ba5);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6a8,"V",&local_1ba6);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_688,"W",&local_1ba7);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_668,"X",&local_1ba8);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_648;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_648,"Y",&local_1ba9);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_628,"Z",&local_1baa);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_608,"A",&local_1bab);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5e8,"B",&local_1bac);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"C",&local_1bad);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"D",&local_1bae);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_588,"E",&local_1baf);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_568,"F",&local_1bb0);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_548,"G",&local_1bb1);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_528,"H",&local_1bb2);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_508,"I",&local_1bb3);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4e8,"J",&local_1bb4);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4c8,"K",&local_1bb5);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4a8,"L",&local_1bb6);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_488,"M",&local_1bb7);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_468,"N",&local_1bb8);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_448,"O",&local_1bb9);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_428,"P",&local_1bba);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_408,"Q",&local_1bbb);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"R",&local_1bbc);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c8,"S",&local_1bbd);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a8,"T",&local_1bbe);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_388,"U",&local_1bbf);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_368,"V",&local_1bc0);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"W",&local_1bc1);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_328,"X",&local_1bc2);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_308,"Y",&local_1bc3);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e8,"Z",&local_1bc4);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"U",&local_1bc5);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"A",&local_1bc6);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288," ",&local_1bc7);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_268,"S",&local_1bc8);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"M",&local_1bc9);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"O",&local_1bca);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"L",&local_1bcb);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"N",&local_1bcc);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"A",&local_1bcd);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"T",&local_1bce);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"I",&local_1bcf);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"O",&local_1bd0);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148,"N",&local_1bd1);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"N",&local_1bd2);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"I",&local_1bd3);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"G",&local_1bd4);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"N",&local_1bd5);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"I",&local_1bd6);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"FREE",&local_1bd7);
  local_1af0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"AE",&local_1bd8);
  vals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  local_48 = &local_1ae8;
  local_40 = 0xd5;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&vals.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38,__l_00,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&vals.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  local_4590 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  do {
    local_4590 = local_4590 + -1;
    std::__cxx11::string::~string((string *)local_4590);
  } while (local_4590 != &local_1ae8);
  std::allocator<char>::~allocator(&local_1bd8);
  std::allocator<char>::~allocator(&local_1bd7);
  std::allocator<char>::~allocator(&local_1bd6);
  std::allocator<char>::~allocator(&local_1bd5);
  std::allocator<char>::~allocator(&local_1bd4);
  std::allocator<char>::~allocator(&local_1bd3);
  std::allocator<char>::~allocator(&local_1bd2);
  std::allocator<char>::~allocator(&local_1bd1);
  std::allocator<char>::~allocator(&local_1bd0);
  std::allocator<char>::~allocator(&local_1bcf);
  std::allocator<char>::~allocator(&local_1bce);
  std::allocator<char>::~allocator(&local_1bcd);
  std::allocator<char>::~allocator(&local_1bcc);
  std::allocator<char>::~allocator(&local_1bcb);
  std::allocator<char>::~allocator(&local_1bca);
  std::allocator<char>::~allocator(&local_1bc9);
  std::allocator<char>::~allocator(&local_1bc8);
  std::allocator<char>::~allocator(&local_1bc7);
  std::allocator<char>::~allocator(&local_1bc6);
  std::allocator<char>::~allocator(&local_1bc5);
  std::allocator<char>::~allocator(&local_1bc4);
  std::allocator<char>::~allocator(&local_1bc3);
  std::allocator<char>::~allocator(&local_1bc2);
  std::allocator<char>::~allocator(&local_1bc1);
  std::allocator<char>::~allocator(&local_1bc0);
  std::allocator<char>::~allocator(&local_1bbf);
  std::allocator<char>::~allocator(&local_1bbe);
  std::allocator<char>::~allocator(&local_1bbd);
  std::allocator<char>::~allocator(&local_1bbc);
  std::allocator<char>::~allocator(&local_1bbb);
  std::allocator<char>::~allocator(&local_1bba);
  std::allocator<char>::~allocator(&local_1bb9);
  std::allocator<char>::~allocator(&local_1bb8);
  std::allocator<char>::~allocator(&local_1bb7);
  std::allocator<char>::~allocator(&local_1bb6);
  std::allocator<char>::~allocator(&local_1bb5);
  std::allocator<char>::~allocator(&local_1bb4);
  std::allocator<char>::~allocator(&local_1bb3);
  std::allocator<char>::~allocator(&local_1bb2);
  std::allocator<char>::~allocator(&local_1bb1);
  std::allocator<char>::~allocator(&local_1bb0);
  std::allocator<char>::~allocator(&local_1baf);
  std::allocator<char>::~allocator(&local_1bae);
  std::allocator<char>::~allocator(&local_1bad);
  std::allocator<char>::~allocator(&local_1bac);
  std::allocator<char>::~allocator(&local_1bab);
  std::allocator<char>::~allocator(&local_1baa);
  std::allocator<char>::~allocator(&local_1ba9);
  std::allocator<char>::~allocator(&local_1ba8);
  std::allocator<char>::~allocator(&local_1ba7);
  std::allocator<char>::~allocator(&local_1ba6);
  std::allocator<char>::~allocator(&local_1ba5);
  std::allocator<char>::~allocator(&local_1ba4);
  std::allocator<char>::~allocator(&local_1ba3);
  std::allocator<char>::~allocator(&local_1ba2);
  std::allocator<char>::~allocator(&local_1ba1);
  std::allocator<char>::~allocator(&local_1ba0);
  std::allocator<char>::~allocator(&local_1b9f);
  std::allocator<char>::~allocator(&local_1b9e);
  std::allocator<char>::~allocator(&local_1b9d);
  std::allocator<char>::~allocator(&local_1b9c);
  std::allocator<char>::~allocator(&local_1b9b);
  std::allocator<char>::~allocator(&local_1b9a);
  std::allocator<char>::~allocator(&local_1b99);
  std::allocator<char>::~allocator(&local_1b98);
  std::allocator<char>::~allocator(&local_1b97);
  std::allocator<char>::~allocator(&local_1b96);
  std::allocator<char>::~allocator(&local_1b95);
  std::allocator<char>::~allocator(&local_1b94);
  std::allocator<char>::~allocator(&local_1b93);
  std::allocator<char>::~allocator(&local_1b92);
  std::allocator<char>::~allocator(&local_1b91);
  std::allocator<char>::~allocator(&local_1b90);
  std::allocator<char>::~allocator(&local_1b8f);
  std::allocator<char>::~allocator(&local_1b8e);
  std::allocator<char>::~allocator(&local_1b8d);
  std::allocator<char>::~allocator(&local_1b8c);
  std::allocator<char>::~allocator(&local_1b8b);
  std::allocator<char>::~allocator(&local_1b8a);
  std::allocator<char>::~allocator(&local_1b89);
  std::allocator<char>::~allocator(&local_1b88);
  std::allocator<char>::~allocator(&local_1b87);
  std::allocator<char>::~allocator(&local_1b86);
  std::allocator<char>::~allocator(&local_1b85);
  std::allocator<char>::~allocator(&local_1b84);
  std::allocator<char>::~allocator(&local_1b83);
  std::allocator<char>::~allocator(&local_1b82);
  std::allocator<char>::~allocator(&local_1b81);
  std::allocator<char>::~allocator(&local_1b80);
  std::allocator<char>::~allocator(&local_1b7f);
  std::allocator<char>::~allocator(&local_1b7e);
  std::allocator<char>::~allocator(&local_1b7d);
  std::allocator<char>::~allocator(&local_1b7c);
  std::allocator<char>::~allocator(&local_1b7b);
  std::allocator<char>::~allocator(&local_1b7a);
  std::allocator<char>::~allocator(&local_1b79);
  std::allocator<char>::~allocator(&local_1b78);
  std::allocator<char>::~allocator(&local_1b77);
  std::allocator<char>::~allocator(&local_1b76);
  std::allocator<char>::~allocator(&local_1b75);
  std::allocator<char>::~allocator(&local_1b74);
  std::allocator<char>::~allocator(&local_1b73);
  std::allocator<char>::~allocator(&local_1b72);
  std::allocator<char>::~allocator(&local_1b71);
  std::allocator<char>::~allocator(&local_1b70);
  std::allocator<char>::~allocator(&local_1b6f);
  std::allocator<char>::~allocator(&local_1b6e);
  std::allocator<char>::~allocator(&local_1b6d);
  std::allocator<char>::~allocator(&local_1b6c);
  std::allocator<char>::~allocator(&local_1b6b);
  std::allocator<char>::~allocator(&local_1b6a);
  std::allocator<char>::~allocator(&local_1b69);
  std::allocator<char>::~allocator(&local_1b68);
  std::allocator<char>::~allocator(&local_1b67);
  std::allocator<char>::~allocator(&local_1b66);
  std::allocator<char>::~allocator(&local_1b65);
  std::allocator<char>::~allocator(&local_1b64);
  std::allocator<char>::~allocator(&local_1b63);
  std::allocator<char>::~allocator(&local_1b62);
  std::allocator<char>::~allocator(&local_1b61);
  std::allocator<char>::~allocator(&local_1b60);
  std::allocator<char>::~allocator(&local_1b5f);
  std::allocator<char>::~allocator(&local_1b5e);
  std::allocator<char>::~allocator(&local_1b5d);
  std::allocator<char>::~allocator(&local_1b5c);
  std::allocator<char>::~allocator(&local_1b5b);
  std::allocator<char>::~allocator(&local_1b5a);
  std::allocator<char>::~allocator(&local_1b59);
  std::allocator<char>::~allocator(&local_1b58);
  std::allocator<char>::~allocator(&local_1b57);
  std::allocator<char>::~allocator(&local_1b56);
  std::allocator<char>::~allocator(&local_1b55);
  std::allocator<char>::~allocator(&local_1b54);
  std::allocator<char>::~allocator(&local_1b53);
  std::allocator<char>::~allocator(&local_1b52);
  std::allocator<char>::~allocator(&local_1b51);
  std::allocator<char>::~allocator(&local_1b50);
  std::allocator<char>::~allocator(&local_1b4f);
  std::allocator<char>::~allocator(&local_1b4e);
  std::allocator<char>::~allocator(&local_1b4d);
  std::allocator<char>::~allocator(&local_1b4c);
  std::allocator<char>::~allocator(&local_1b4b);
  std::allocator<char>::~allocator(&local_1b4a);
  std::allocator<char>::~allocator(&local_1b49);
  std::allocator<char>::~allocator(&local_1b48);
  std::allocator<char>::~allocator(&local_1b47);
  std::allocator<char>::~allocator(&local_1b46);
  std::allocator<char>::~allocator(&local_1b45);
  std::allocator<char>::~allocator(&local_1b44);
  std::allocator<char>::~allocator(&local_1b43);
  std::allocator<char>::~allocator(&local_1b42);
  std::allocator<char>::~allocator(&local_1b41);
  std::allocator<char>::~allocator(&local_1b40);
  std::allocator<char>::~allocator(&local_1b3f);
  std::allocator<char>::~allocator(&local_1b3e);
  std::allocator<char>::~allocator(&local_1b3d);
  std::allocator<char>::~allocator(&local_1b3c);
  std::allocator<char>::~allocator(&local_1b3b);
  std::allocator<char>::~allocator(&local_1b3a);
  std::allocator<char>::~allocator(&local_1b39);
  std::allocator<char>::~allocator(&local_1b38);
  std::allocator<char>::~allocator(&local_1b37);
  std::allocator<char>::~allocator(&local_1b36);
  std::allocator<char>::~allocator(&local_1b35);
  std::allocator<char>::~allocator(&local_1b34);
  std::allocator<char>::~allocator(&local_1b33);
  std::allocator<char>::~allocator(&local_1b32);
  std::allocator<char>::~allocator(&local_1b31);
  std::allocator<char>::~allocator(&local_1b30);
  std::allocator<char>::~allocator(&local_1b2f);
  std::allocator<char>::~allocator(&local_1b2e);
  std::allocator<char>::~allocator(&local_1b2d);
  std::allocator<char>::~allocator(&local_1b2c);
  std::allocator<char>::~allocator(&local_1b2b);
  std::allocator<char>::~allocator(&local_1b2a);
  std::allocator<char>::~allocator(&local_1b29);
  std::allocator<char>::~allocator(&local_1b28);
  std::allocator<char>::~allocator(&local_1b27);
  std::allocator<char>::~allocator(&local_1b26);
  std::allocator<char>::~allocator(&local_1b25);
  std::allocator<char>::~allocator(&local_1b24);
  std::allocator<char>::~allocator(&local_1b23);
  std::allocator<char>::~allocator(&local_1b22);
  std::allocator<char>::~allocator(&local_1b21);
  std::allocator<char>::~allocator(&local_1b20);
  std::allocator<char>::~allocator(&local_1b1f);
  std::allocator<char>::~allocator(&local_1b1e);
  std::allocator<char>::~allocator(&local_1b1d);
  std::allocator<char>::~allocator(&local_1b1c);
  std::allocator<char>::~allocator(&local_1b1b);
  std::allocator<char>::~allocator(&local_1b1a);
  std::allocator<char>::~allocator(&local_1b19);
  std::allocator<char>::~allocator(&local_1b18);
  std::allocator<char>::~allocator(&local_1b17);
  std::allocator<char>::~allocator(&local_1b16);
  std::allocator<char>::~allocator(&local_1b15);
  std::allocator<char>::~allocator(&local_1b14);
  std::allocator<char>::~allocator(&local_1b13);
  std::allocator<char>::~allocator(&local_1b12);
  std::allocator<char>::~allocator(&local_1b11);
  std::allocator<char>::~allocator(&local_1b10);
  std::allocator<char>::~allocator(&local_1b0f);
  std::allocator<char>::~allocator(&local_1b0e);
  std::allocator<char>::~allocator(&local_1b0d);
  std::allocator<char>::~allocator(&local_1b0c);
  std::allocator<char>::~allocator(&local_1b0b);
  std::allocator<char>::~allocator(&local_1b0a);
  std::allocator<char>::~allocator(&local_1b09);
  std::allocator<char>::~allocator(&local_1b08);
  std::allocator<char>::~allocator(&local_1b07);
  std::allocator<char>::~allocator(&local_1b06);
  std::allocator<char>::~allocator(local_1b05);
  std::allocator<char>::~allocator(&local_1af1);
  local_3786 = 1;
  local_36b0 = &local_36a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_36a8,anon_var_dwarf_15b80,&local_36b1);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3688;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3688,anon_var_dwarf_15b8c,&local_36b2);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3668;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3668,anon_var_dwarf_15b98,&local_36b3);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3648;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3648,anon_var_dwarf_15ba4,&local_36b4);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3628;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3628,anon_var_dwarf_15bb0,&local_36b5);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3608;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3608,anon_var_dwarf_15bbc,&local_36b6);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_35e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_35e8,anon_var_dwarf_15bc8,&local_36b7);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_35c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_35c8,anon_var_dwarf_15bd4,&local_36b8);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_35a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_35a8,anon_var_dwarf_15be0,&local_36b9);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3588,anon_var_dwarf_15bec,&local_36ba);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3568;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3568,anon_var_dwarf_16522 + 0xf,&local_36bb);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3548,anon_var_dwarf_15c04,&local_36bc);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3528,anon_var_dwarf_15c10,&local_36bd);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3508;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3508,anon_var_dwarf_15c1c,&local_36be);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_34e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_34e8,anon_var_dwarf_15c28,&local_36bf);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_34c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_34c8,anon_var_dwarf_15c34,&local_36c0);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_34a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_34a8,anon_var_dwarf_15c40,&local_36c1);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3488,anon_var_dwarf_15c4c,&local_36c2);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3468,anon_var_dwarf_15c58,&local_36c3);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3448,anon_var_dwarf_15c64,&local_36c4);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3428,anon_var_dwarf_15c70,&local_36c5);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3408,anon_var_dwarf_15c7c,&local_36c6);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_33e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_33e8,anon_var_dwarf_15c88,&local_36c7);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_33c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_33c8,anon_var_dwarf_15c94,&local_36c8);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_33a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_33a8,anon_var_dwarf_15ca0,&local_36c9);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3388,anon_var_dwarf_15cac,&local_36ca);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3368,anon_var_dwarf_15cb8,&local_36cb);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3348,anon_var_dwarf_15cc4,&local_36cc);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3328,anon_var_dwarf_15cd0,&local_36cd);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3308,anon_var_dwarf_15cdc,&local_36ce);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_32e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_32e8,anon_var_dwarf_15ce8,&local_36cf);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_32c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_32c8,anon_var_dwarf_15cf4,&local_36d0);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_32a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_32a8,anon_var_dwarf_15d00,&local_36d1);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3288,anon_var_dwarf_15d0c,&local_36d2);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3268,anon_var_dwarf_1653a + 0x60,&local_36d3);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3248,anon_var_dwarf_15d24,&local_36d4);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3228,anon_var_dwarf_15d30,&local_36d5);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3208,anon_var_dwarf_15d3c,&local_36d6);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_31e8,anon_var_dwarf_15d48,&local_36d7);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_31c8,anon_var_dwarf_15d54,&local_36d8);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_31a8,anon_var_dwarf_15d60,&local_36d9);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3188,anon_var_dwarf_15d6c,&local_36da);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3168,anon_var_dwarf_15d78,&local_36db);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3148,anon_var_dwarf_15d84,&local_36dc);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3128,anon_var_dwarf_15d90,&local_36dd);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3108,anon_var_dwarf_15d9c,&local_36de);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30e8,anon_var_dwarf_15da8,&local_36df);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30c8,anon_var_dwarf_15db4,&local_36e0);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30a8,anon_var_dwarf_15dc0,&local_36e1);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3088;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3088,anon_var_dwarf_15dcc,&local_36e2);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3068;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3068,anon_var_dwarf_15dd8,&local_36e3);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3048;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3048,anon_var_dwarf_15de4,&local_36e4);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3028;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3028,anon_var_dwarf_15df0,&local_36e5);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3008;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3008,anon_var_dwarf_15dfc,&local_36e6);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2fe8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2fe8,anon_var_dwarf_15e08,&local_36e7);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2fc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2fc8,anon_var_dwarf_15e14,&local_36e8);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2fa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2fa8,anon_var_dwarf_15e20,&local_36e9);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f88,anon_var_dwarf_15e2c,&local_36ea);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f68,anon_var_dwarf_15e38,&local_36eb);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f48,anon_var_dwarf_15e44,&local_36ec);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f28,anon_var_dwarf_15e50,&local_36ed);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f08,anon_var_dwarf_15e5c,&local_36ee);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ee8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2ee8,anon_var_dwarf_1656e + 0x51,&local_36ef);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ec8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2ec8,anon_var_dwarf_15e74,&local_36f0);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ea8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2ea8,anon_var_dwarf_15e80,&local_36f1);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e88,anon_var_dwarf_15e8c,&local_36f2);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e68,anon_var_dwarf_15e98,&local_36f3);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e48,anon_var_dwarf_15152,&local_36f4);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e28,anon_var_dwarf_15ea4,&local_36f5);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e08,anon_var_dwarf_14e2e,&local_36f6);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2de8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2de8,anon_var_dwarf_15eb0,&local_36f7);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2dc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2dc8,anon_var_dwarf_144da,&local_36f8);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2da8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2da8,anon_var_dwarf_15ebc,&local_36f9);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d88,anon_var_dwarf_15ec8,&local_36fa);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d68,anon_var_dwarf_15ed4,&local_36fb);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d48,anon_var_dwarf_15ee0,&local_36fc);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d28,anon_var_dwarf_14053,&local_36fd);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d08,anon_var_dwarf_15eec,&local_36fe);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ce8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2ce8,anon_var_dwarf_15ef8,&local_36ff);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2cc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2cc8,anon_var_dwarf_15f04,&local_3700);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ca8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2ca8,anon_var_dwarf_15746,&local_3701);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c88,anon_var_dwarf_15f10,&local_3702);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c68,anon_var_dwarf_15f1c,&local_3703);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c48,anon_var_dwarf_15f28,&local_3704);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c28,anon_var_dwarf_15f34,&local_3705);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c08,anon_var_dwarf_15f40,&local_3706);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2be8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2be8,anon_var_dwarf_15f4c,&local_3707);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2bc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2bc8,anon_var_dwarf_14672,&local_3708);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ba8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2ba8,anon_var_dwarf_165a2 + 100,&local_3709);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b88,anon_var_dwarf_15f64,&local_370a);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b68,anon_var_dwarf_15f70,&local_370b);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b48,anon_var_dwarf_15f7c,&local_370c);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b28,anon_var_dwarf_15f88,&local_370d);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b08,anon_var_dwarf_15f94,&local_370e);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ae8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2ae8,anon_var_dwarf_15fa0,&local_370f);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ac8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2ac8,anon_var_dwarf_15fac,&local_3710);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2aa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2aa8,anon_var_dwarf_15fb8,&local_3711);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a88,anon_var_dwarf_15fc4,&local_3712);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a68,anon_var_dwarf_15fd0,&local_3713);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a48,anon_var_dwarf_15fdc,&local_3714);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a28,anon_var_dwarf_15fe8,&local_3715);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a08,anon_var_dwarf_15ff4,&local_3716);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_29e8,anon_var_dwarf_16000,&local_3717);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_29c8,anon_var_dwarf_1600c,&local_3718);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_29a8,anon_var_dwarf_16018,&local_3719);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2988;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2988,anon_var_dwarf_16024,&local_371a);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2968;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2968,anon_var_dwarf_16030,&local_371b);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2948;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2948,anon_var_dwarf_1603c,&local_371c);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2928;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2928,anon_var_dwarf_16048,&local_371d);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2908;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2908,anon_var_dwarf_16054,&local_371e);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_28e8,anon_var_dwarf_16060,&local_371f);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_28c8,anon_var_dwarf_1606c,&local_3720);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_28a8,anon_var_dwarf_16078,&local_3721);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2888;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2888,anon_var_dwarf_16084,&local_3722);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2868,anon_var_dwarf_165d6 + 100,&local_3723);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2848;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2848,anon_var_dwarf_1609c,&local_3724);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2828;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2828,anon_var_dwarf_160a8,&local_3725);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2808;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2808,anon_var_dwarf_160b4,&local_3726);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_27e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_27e8,anon_var_dwarf_160c0,&local_3727);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_27c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_27c8,anon_var_dwarf_1539e,&local_3728);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_27a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_27a8,anon_var_dwarf_160cc,&local_3729);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2788;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2788,anon_var_dwarf_160d8,&local_372a);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2768;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2768,anon_var_dwarf_160e4,&local_372b);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2748;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2748,anon_var_dwarf_160f0,&local_372c);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2728;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2728,"J",&local_372d);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2708;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2708,anon_var_dwarf_160fc,&local_372e);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_26e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_26e8,anon_var_dwarf_16108,&local_372f);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_26c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_26c8,anon_var_dwarf_16114,&local_3730);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_26a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_26a8,anon_var_dwarf_14216,&local_3731);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2688;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2688,anon_var_dwarf_16120,&local_3732);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2668;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2668,anon_var_dwarf_1612c,&local_3733);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2648;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2648,"Q",&local_3734);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2628;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2628,anon_var_dwarf_15956,&local_3735);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2608;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2608,anon_var_dwarf_16138,&local_3736);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_25e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_25e8,anon_var_dwarf_16144,&local_3737);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_25c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_25c8,anon_var_dwarf_16150,&local_3738);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_25a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_25a8,"V",&local_3739);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2588,anon_var_dwarf_1615c,&local_373a);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2568;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2568,anon_var_dwarf_16168,&local_373b);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2548,anon_var_dwarf_148d6,&local_373c);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2528,anon_var_dwarf_165e2 + 0x3e,&local_373d);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2508;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2508,anon_var_dwarf_16180,&local_373e);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_24e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_24e8,anon_var_dwarf_1618c,&local_373f);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_24c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_24c8,anon_var_dwarf_16198,&local_3740);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_24a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_24a8,anon_var_dwarf_161a4,&local_3741);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2488,anon_var_dwarf_1515e,&local_3742);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2468,anon_var_dwarf_161b0,&local_3743);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2448,anon_var_dwarf_14e3a,&local_3744);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2428,anon_var_dwarf_161bc,&local_3745);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2408,anon_var_dwarf_144e6,&local_3746);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_23e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_23e8,anon_var_dwarf_161c8,&local_3747);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_23c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_23c8,anon_var_dwarf_161d4,&local_3748);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_23a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_23a8,anon_var_dwarf_161e0,&local_3749);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2388,anon_var_dwarf_161ec,&local_374a);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2368,anon_var_dwarf_1405e,&local_374b);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2348,anon_var_dwarf_161f8,&local_374c);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2328,anon_var_dwarf_16204,&local_374d);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2308,anon_var_dwarf_16210,&local_374e);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_22e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_22e8,anon_var_dwarf_15752,&local_374f);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_22c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_22c8,anon_var_dwarf_1621c,&local_3750);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_22a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_22a8,anon_var_dwarf_16228,&local_3751);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2288,anon_var_dwarf_16234,&local_3752);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2268,anon_var_dwarf_16240,&local_3753);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2248,anon_var_dwarf_1624c,&local_3754);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2228,anon_var_dwarf_16258,&local_3755);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2208,anon_var_dwarf_1467e,&local_3756);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_21e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_21e8,anon_var_dwarf_165fc + 100,&local_3757);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_21c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_21c8,anon_var_dwarf_16270,&local_3758);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_21a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_21a8,anon_var_dwarf_1627c,&local_3759);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2188,anon_var_dwarf_16288,&local_375a);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2168,anon_var_dwarf_16294,&local_375b);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2148,anon_var_dwarf_162a0,&local_375c);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2128,anon_var_dwarf_162ac,&local_375d);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2108,anon_var_dwarf_162b8,&local_375e);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_20e8,anon_var_dwarf_162c4,&local_375f);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_20c8,anon_var_dwarf_162d0,&local_3760);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_20a8,anon_var_dwarf_162dc,&local_3761);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2088;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2088,anon_var_dwarf_162e8,&local_3762);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2068;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2068,anon_var_dwarf_162f4,&local_3763);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2048;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2048,anon_var_dwarf_16300,&local_3764);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2028;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2028,anon_var_dwarf_1630c,&local_3765);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2008;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2008,anon_var_dwarf_16318,&local_3766);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1fe8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1fe8,anon_var_dwarf_16324,&local_3767);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1fc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1fc8,anon_var_dwarf_16330,&local_3768);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1fa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1fa8,anon_var_dwarf_1633c,&local_3769);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f88,anon_var_dwarf_16348,&local_376a);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f68,anon_var_dwarf_16354,&local_376b);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f48,anon_var_dwarf_16360,&local_376c);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f28,anon_var_dwarf_1636c,&local_376d);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f08,anon_var_dwarf_16378,&local_376e);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ee8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1ee8,anon_var_dwarf_16384,&local_376f);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ec8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1ec8,anon_var_dwarf_16390,&local_3770);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ea8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ea8,anon_var_dwarf_16608 + 100,&local_3771);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e88,anon_var_dwarf_163a8,&local_3772);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e68,anon_var_dwarf_163b4,&local_3773);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e48," ",&local_3774);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e28,anon_var_dwarf_163c0,&local_3775);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e08,anon_var_dwarf_163cc,&local_3776);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1de8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1de8,anon_var_dwarf_163d8,&local_3777);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1dc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1dc8,anon_var_dwarf_163e4,&local_3778);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1da8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1da8,anon_var_dwarf_16484 + 0x1a,&local_3779);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d88,anon_var_dwarf_15b98,&local_377a);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d68,anon_var_dwarf_163fc,&local_377b);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d48,anon_var_dwarf_16408,&local_377c);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d28,anon_var_dwarf_163d8,&local_377d);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d08,anon_var_dwarf_16484 + 0x1a,&local_377e);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ce8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1ce8,anon_var_dwarf_16414,&local_377f);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1cc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1cc8,anon_var_dwarf_14b6a,&local_3780);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ca8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ca8,anon_var_dwarf_164aa + 4,(allocator<char> *)((long)&x + 3));
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c88,anon_var_dwarf_16420,(allocator<char> *)((long)&x + 2));
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c68,anon_var_dwarf_1642c,(allocator<char> *)((long)&x + 1));
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c48,anon_var_dwarf_16438,(allocator<char> *)&x);
  local_36b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c28,anon_var_dwarf_16444,&local_3785);
  local_3786 = 0;
  local_1c08 = &local_36a8;
  local_1c00 = 0xd5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_3787);
  __l._M_len = local_1c00;
  __l._M_array = local_1c08;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1bf8,__l,&local_3787);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_3787);
  local_5300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c08;
  do {
    local_5300 = local_5300 + -1;
    std::__cxx11::string::~string((string *)local_5300);
  } while (local_5300 != &local_36a8);
  std::allocator<char>::~allocator(&local_3785);
  std::allocator<char>::~allocator((allocator<char> *)&x);
  std::allocator<char>::~allocator((allocator<char> *)((long)&x + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&x + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&x + 3));
  std::allocator<char>::~allocator(&local_3780);
  std::allocator<char>::~allocator(&local_377f);
  std::allocator<char>::~allocator(&local_377e);
  std::allocator<char>::~allocator(&local_377d);
  std::allocator<char>::~allocator(&local_377c);
  std::allocator<char>::~allocator(&local_377b);
  std::allocator<char>::~allocator(&local_377a);
  std::allocator<char>::~allocator(&local_3779);
  std::allocator<char>::~allocator(&local_3778);
  std::allocator<char>::~allocator(&local_3777);
  std::allocator<char>::~allocator(&local_3776);
  std::allocator<char>::~allocator(&local_3775);
  std::allocator<char>::~allocator(&local_3774);
  std::allocator<char>::~allocator(&local_3773);
  std::allocator<char>::~allocator(&local_3772);
  std::allocator<char>::~allocator(&local_3771);
  std::allocator<char>::~allocator(&local_3770);
  std::allocator<char>::~allocator(&local_376f);
  std::allocator<char>::~allocator(&local_376e);
  std::allocator<char>::~allocator(&local_376d);
  std::allocator<char>::~allocator(&local_376c);
  std::allocator<char>::~allocator(&local_376b);
  std::allocator<char>::~allocator(&local_376a);
  std::allocator<char>::~allocator(&local_3769);
  std::allocator<char>::~allocator(&local_3768);
  std::allocator<char>::~allocator(&local_3767);
  std::allocator<char>::~allocator(&local_3766);
  std::allocator<char>::~allocator(&local_3765);
  std::allocator<char>::~allocator(&local_3764);
  std::allocator<char>::~allocator(&local_3763);
  std::allocator<char>::~allocator(&local_3762);
  std::allocator<char>::~allocator(&local_3761);
  std::allocator<char>::~allocator(&local_3760);
  std::allocator<char>::~allocator(&local_375f);
  std::allocator<char>::~allocator(&local_375e);
  std::allocator<char>::~allocator(&local_375d);
  std::allocator<char>::~allocator(&local_375c);
  std::allocator<char>::~allocator(&local_375b);
  std::allocator<char>::~allocator(&local_375a);
  std::allocator<char>::~allocator(&local_3759);
  std::allocator<char>::~allocator(&local_3758);
  std::allocator<char>::~allocator(&local_3757);
  std::allocator<char>::~allocator(&local_3756);
  std::allocator<char>::~allocator(&local_3755);
  std::allocator<char>::~allocator(&local_3754);
  std::allocator<char>::~allocator(&local_3753);
  std::allocator<char>::~allocator(&local_3752);
  std::allocator<char>::~allocator(&local_3751);
  std::allocator<char>::~allocator(&local_3750);
  std::allocator<char>::~allocator(&local_374f);
  std::allocator<char>::~allocator(&local_374e);
  std::allocator<char>::~allocator(&local_374d);
  std::allocator<char>::~allocator(&local_374c);
  std::allocator<char>::~allocator(&local_374b);
  std::allocator<char>::~allocator(&local_374a);
  std::allocator<char>::~allocator(&local_3749);
  std::allocator<char>::~allocator(&local_3748);
  std::allocator<char>::~allocator(&local_3747);
  std::allocator<char>::~allocator(&local_3746);
  std::allocator<char>::~allocator(&local_3745);
  std::allocator<char>::~allocator(&local_3744);
  std::allocator<char>::~allocator(&local_3743);
  std::allocator<char>::~allocator(&local_3742);
  std::allocator<char>::~allocator(&local_3741);
  std::allocator<char>::~allocator(&local_3740);
  std::allocator<char>::~allocator(&local_373f);
  std::allocator<char>::~allocator(&local_373e);
  std::allocator<char>::~allocator(&local_373d);
  std::allocator<char>::~allocator(&local_373c);
  std::allocator<char>::~allocator(&local_373b);
  std::allocator<char>::~allocator(&local_373a);
  std::allocator<char>::~allocator(&local_3739);
  std::allocator<char>::~allocator(&local_3738);
  std::allocator<char>::~allocator(&local_3737);
  std::allocator<char>::~allocator(&local_3736);
  std::allocator<char>::~allocator(&local_3735);
  std::allocator<char>::~allocator(&local_3734);
  std::allocator<char>::~allocator(&local_3733);
  std::allocator<char>::~allocator(&local_3732);
  std::allocator<char>::~allocator(&local_3731);
  std::allocator<char>::~allocator(&local_3730);
  std::allocator<char>::~allocator(&local_372f);
  std::allocator<char>::~allocator(&local_372e);
  std::allocator<char>::~allocator(&local_372d);
  std::allocator<char>::~allocator(&local_372c);
  std::allocator<char>::~allocator(&local_372b);
  std::allocator<char>::~allocator(&local_372a);
  std::allocator<char>::~allocator(&local_3729);
  std::allocator<char>::~allocator(&local_3728);
  std::allocator<char>::~allocator(&local_3727);
  std::allocator<char>::~allocator(&local_3726);
  std::allocator<char>::~allocator(&local_3725);
  std::allocator<char>::~allocator(&local_3724);
  std::allocator<char>::~allocator(&local_3723);
  std::allocator<char>::~allocator(&local_3722);
  std::allocator<char>::~allocator(&local_3721);
  std::allocator<char>::~allocator(&local_3720);
  std::allocator<char>::~allocator(&local_371f);
  std::allocator<char>::~allocator(&local_371e);
  std::allocator<char>::~allocator(&local_371d);
  std::allocator<char>::~allocator(&local_371c);
  std::allocator<char>::~allocator(&local_371b);
  std::allocator<char>::~allocator(&local_371a);
  std::allocator<char>::~allocator(&local_3719);
  std::allocator<char>::~allocator(&local_3718);
  std::allocator<char>::~allocator(&local_3717);
  std::allocator<char>::~allocator(&local_3716);
  std::allocator<char>::~allocator(&local_3715);
  std::allocator<char>::~allocator(&local_3714);
  std::allocator<char>::~allocator(&local_3713);
  std::allocator<char>::~allocator(&local_3712);
  std::allocator<char>::~allocator(&local_3711);
  std::allocator<char>::~allocator(&local_3710);
  std::allocator<char>::~allocator(&local_370f);
  std::allocator<char>::~allocator(&local_370e);
  std::allocator<char>::~allocator(&local_370d);
  std::allocator<char>::~allocator(&local_370c);
  std::allocator<char>::~allocator(&local_370b);
  std::allocator<char>::~allocator(&local_370a);
  std::allocator<char>::~allocator(&local_3709);
  std::allocator<char>::~allocator(&local_3708);
  std::allocator<char>::~allocator(&local_3707);
  std::allocator<char>::~allocator(&local_3706);
  std::allocator<char>::~allocator(&local_3705);
  std::allocator<char>::~allocator(&local_3704);
  std::allocator<char>::~allocator(&local_3703);
  std::allocator<char>::~allocator(&local_3702);
  std::allocator<char>::~allocator(&local_3701);
  std::allocator<char>::~allocator(&local_3700);
  std::allocator<char>::~allocator(&local_36ff);
  std::allocator<char>::~allocator(&local_36fe);
  std::allocator<char>::~allocator(&local_36fd);
  std::allocator<char>::~allocator(&local_36fc);
  std::allocator<char>::~allocator(&local_36fb);
  std::allocator<char>::~allocator(&local_36fa);
  std::allocator<char>::~allocator(&local_36f9);
  std::allocator<char>::~allocator(&local_36f8);
  std::allocator<char>::~allocator(&local_36f7);
  std::allocator<char>::~allocator(&local_36f6);
  std::allocator<char>::~allocator(&local_36f5);
  std::allocator<char>::~allocator(&local_36f4);
  std::allocator<char>::~allocator(&local_36f3);
  std::allocator<char>::~allocator(&local_36f2);
  std::allocator<char>::~allocator(&local_36f1);
  std::allocator<char>::~allocator(&local_36f0);
  std::allocator<char>::~allocator(&local_36ef);
  std::allocator<char>::~allocator(&local_36ee);
  std::allocator<char>::~allocator(&local_36ed);
  std::allocator<char>::~allocator(&local_36ec);
  std::allocator<char>::~allocator(&local_36eb);
  std::allocator<char>::~allocator(&local_36ea);
  std::allocator<char>::~allocator(&local_36e9);
  std::allocator<char>::~allocator(&local_36e8);
  std::allocator<char>::~allocator(&local_36e7);
  std::allocator<char>::~allocator(&local_36e6);
  std::allocator<char>::~allocator(&local_36e5);
  std::allocator<char>::~allocator(&local_36e4);
  std::allocator<char>::~allocator(&local_36e3);
  std::allocator<char>::~allocator(&local_36e2);
  std::allocator<char>::~allocator(&local_36e1);
  std::allocator<char>::~allocator(&local_36e0);
  std::allocator<char>::~allocator(&local_36df);
  std::allocator<char>::~allocator(&local_36de);
  std::allocator<char>::~allocator(&local_36dd);
  std::allocator<char>::~allocator(&local_36dc);
  std::allocator<char>::~allocator(&local_36db);
  std::allocator<char>::~allocator(&local_36da);
  std::allocator<char>::~allocator(&local_36d9);
  std::allocator<char>::~allocator(&local_36d8);
  std::allocator<char>::~allocator(&local_36d7);
  std::allocator<char>::~allocator(&local_36d6);
  std::allocator<char>::~allocator(&local_36d5);
  std::allocator<char>::~allocator(&local_36d4);
  std::allocator<char>::~allocator(&local_36d3);
  std::allocator<char>::~allocator(&local_36d2);
  std::allocator<char>::~allocator(&local_36d1);
  std::allocator<char>::~allocator(&local_36d0);
  std::allocator<char>::~allocator(&local_36cf);
  std::allocator<char>::~allocator(&local_36ce);
  std::allocator<char>::~allocator(&local_36cd);
  std::allocator<char>::~allocator(&local_36cc);
  std::allocator<char>::~allocator(&local_36cb);
  std::allocator<char>::~allocator(&local_36ca);
  std::allocator<char>::~allocator(&local_36c9);
  std::allocator<char>::~allocator(&local_36c8);
  std::allocator<char>::~allocator(&local_36c7);
  std::allocator<char>::~allocator(&local_36c6);
  std::allocator<char>::~allocator(&local_36c5);
  std::allocator<char>::~allocator(&local_36c4);
  std::allocator<char>::~allocator(&local_36c3);
  std::allocator<char>::~allocator(&local_36c2);
  std::allocator<char>::~allocator(&local_36c1);
  std::allocator<char>::~allocator(&local_36c0);
  std::allocator<char>::~allocator(&local_36bf);
  std::allocator<char>::~allocator(&local_36be);
  std::allocator<char>::~allocator(&local_36bd);
  std::allocator<char>::~allocator(&local_36bc);
  std::allocator<char>::~allocator(&local_36bb);
  std::allocator<char>::~allocator(&local_36ba);
  std::allocator<char>::~allocator(&local_36b9);
  std::allocator<char>::~allocator(&local_36b8);
  std::allocator<char>::~allocator(&local_36b7);
  std::allocator<char>::~allocator(&local_36b6);
  std::allocator<char>::~allocator(&local_36b5);
  std::allocator<char>::~allocator(&local_36b4);
  std::allocator<char>::~allocator(&local_36b3);
  std::allocator<char>::~allocator(&local_36b2);
  std::allocator<char>::~allocator(&local_36b1);
  local_378c = 0;
  while( true ) {
    uVar1 = (ulong)local_378c;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
    if (sVar2 <= uVar1) break;
    __x = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_38,(long)local_378c);
    __y = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1bf8,(long)local_378c);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&matcher,__x,__y);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&matcher);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&matcher);
    local_378c = local_378c + 1;
  }
  this_00 = (ConfusableMatcher *)operator_new(0x2000);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_37f0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3828._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_3828._M_h._M_rehash_policy._4_4_ = 0;
  local_3828._M_h._M_rehash_policy._M_next_resize = 0;
  local_3828._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_3828._M_h._M_element_count = 0;
  local_3828._M_h._M_buckets = (__buckets_ptr)0x0;
  local_3828._M_h._M_bucket_count = 0;
  local_3828._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_3828);
  ConfusableMatcher::ConfusableMatcher(this_00,&local_37f0,&local_3828,true);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_3828);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_37f0);
  local_37d8 = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1bf8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_00;
}

Assistant:

ConfusableMatcher *LidlNormalizerCMSetup()
{
	auto map = GetDefaultMap();

	// Additional test data
	std::vector<std::string> keys = { 
		"A", "A", "A", "A", "B", "U", "U", "O", "O", "A", "A",
		"A", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y",
		"Z", "A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z", "0",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"U", "A", " ", "S", "M", "O", "L", "N", "A", "T", "I", "O", "N", "N", "I", "G", "N", "I", "FREE", "AE"
	};
	std::vector<std::string> vals = {
		"\U00000105", "\U0000ab31", "\U00001d43", "\U000000e5", "\U0000249d", "\U000000fc", "\U000000dc", "\U000000f6", "\U000000d6", "\U000000e4", "\U000000c4", "\U0000249c", "\U0000249e", "\U0000249f", "\U000024a0", "\U000024a1", "\U000024a2", "\U000024a3", "\U000024a4", "\U000024a5", "\U000024a6", "\U000024a7", "\U000024a8", "\U000024a9", "\U000024aa", "\U000024ab", "\U000024ac", "\U000024ad", "\U000024ae", "\U000024af", "\U000024b0", "\U000024b1", "\U000024b2", "\U000024b3", "\U000024b4", "\U000024cf", "\U000024d0", "\U000024d1", "\U000024d2", "\U000024d3", "\U000024d4", "\U000024d5", "\U000024d6", "\U000024d7", "\U000024d8", "\U000024d9", "\U000024da", "\U000024db", "\U000024dc", "\U000024dd", "\U000024de", "\U000024df", "\U000024e0", "\U000024e1", "\U000024e2", "\U000024e3", "\U000024e4", "\U000024e5", "\U000024e6", "\U000024e7", "\U000024e8", "\U000024e9", "\U000024ea", "\U0001d552", "\U0001d553", "\U0001d554", "\U0001d555", "\U0001d556", "\U0001d557", "\U0001d558", "\U0001d559", "\U0001d55a", "\U0001d55b", "\U0001d55c", "\U0001d55d", "\U0001d55e", "\U0001d55f", "\U0001d560", "\U0001d561", "\U0001d562", "\U0001d563", "\U0001d564", "\U0001d565", "\U0001d566", "\U0001d567", "\U0001d568", "\U0001d569", "\U0001d56a", "\U0001d56b", "\U0001f130", "\U0001f131", "\U0001f132", "\U0001f133", "\U0001f134", "\U0001f135", "\U0001f136", "\U0001f137", "\U0001f138", "\U0001f139", "\U0001f13a", "\U0001f13b", "\U0001f13c", "\U0001f13d", "\U0001f13e", "\U0001f13f", "\U0001f140", "\U0001f141", "\U0001f142", "\U0001f143", "\U0001f144", "\U0001f145", "\U0001f146", "\U0001f147", "\U0001f148", "\U0001f149", "\U000020b3", "\U00000e3f", "\U000020b5", "\U00000110", "\U00000246", "\U000020a3", "\U000020b2", "\U00002c67", "\U00000142", "\U0000004a", "\U000020ad", "\U00002c60", "\U000020a5", "\U000020a6", "\U000000d8", "\U000020b1", "\U00000051", "\U00002c64", "\U000020b4", "\U000020ae", "\U00000244", "\U00000056", "\U000020a9", "\U000004fe", "\U0000024e", "\U00002c6b", "\U0001d586", "\U0001d587", "\U0001d588", "\U0001d589", "\U0001d58a", "\U0001d58b", "\U0001d58c", "\U0001d58d", "\U0001d58e", "\U0001d58f", "\U0001d590", "\U0001d591", "\U0001d592", "\U0001d593", "\U0001d594", "\U0001d595", "\U0001d596", "\U0001d597", "\U0001d598", "\U0001d599", "\U0001d59a", "\U0001d59b", "\U0001d59c", "\U0001d59d", "\U0001d59e", "\U0001d59f", "\U0001f170", "\U0001f171", "\U0001f172", "\U0001f173", "\U0001f174", "\U0001f175", "\U0001f176", "\U0001f177", "\U0001f178", "\U0001f179", "\U0001f17a", "\U0001f17b", "\U0001f17c", "\U0001f17d", "\U0001f17e", "\U0001f17f", "\U0001f180", "\U0001f181", "\U0001f182", "\U0001f183", "\U0001f184", "\U0001f185", "\U0001f186", "\U0001f187", "\U0001f188", "\U0001f189", "\U0001f1fa", "\U0001f1e6", " ", "\U000002e2", "\U00001d50", "\U00001d52", "\U000002e1", "\U0000207f", "\U00001d43", "\U00001d57", "\U00001da6", "\U00001d52", "\U0000207f", "\U0000041d", "\U00000438", "\U00000433", "\U0001F1F3", "\U0001F1EE", "\U0001f193", "\U00001d2d"
	};
	
	for (auto x = 0;x < keys.size();x++)
		map.push_back(std::pair(keys[x], vals[x]));

	auto matcher = new ConfusableMatcher(map, { });

	return matcher;
}